

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaptexture.cpp
# Opt level: O3

BYTE * __thiscall FAutomapTexture::GetColumn(FAutomapTexture *this,uint column,Span **spans_out)

{
  uint uVar1;
  
  if (this->Pixels == (BYTE *)0x0) {
    MakeTexture(this);
  }
  uVar1 = (uint)(this->super_FTexture).Width;
  if (uVar1 <= column) {
    column = column % uVar1;
  }
  if (spans_out != (Span **)0x0) {
    *spans_out = this->DummySpan;
  }
  return this->Pixels + column * (this->super_FTexture).Height;
}

Assistant:

const BYTE *FAutomapTexture::GetColumn (unsigned int column, const Span **spans_out)
{
	if (Pixels == NULL)
	{
		MakeTexture ();
	}
	if ((unsigned)column >= (unsigned)Width)
	{
		column %= Width;
	}
	if (spans_out != NULL)
	{
		*spans_out = DummySpan;
	}
	return Pixels + column*Height;
}